

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

void check<std::__cxx11::string&>
               (bool condition,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t1
               )

{
  runtime_error *this;
  byte in_DIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000150;
  char (*in_stack_00000158) [1];
  undefined1 in_stack_00000160 [16];
  undefined3 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffb4;
  string local_30 [47];
  byte local_1;
  
  local_1 = in_DIL & 1;
  if (local_1 == 0) {
    uVar1 = CONCAT13(1,in_stack_ffffffffffffffb0);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,uVar1),"");
    str::concat<char_const(&)[1],std::__cxx11::string&>
              ((string_view)in_stack_00000160,in_stack_00000158,in_stack_00000150);
    std::runtime_error::runtime_error(this,local_30);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void check(bool condition, T1&& t1, T2&&... t2) {
    if (!condition) {
        throw std::runtime_error(str::concat("", "", std::forward<T1>(t1), std::forward<T2>(t2)...));
    }
}